

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O0

bool __thiscall
bssl::ssl_encrypt_client_hello(bssl *this,SSL_HANDSHAKE *hs,Span<const_unsigned_char> enc)

{
  bssl *this_00;
  code *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  byte bVar4;
  uint16_t uVar5;
  int iVar6;
  cbb_st *pcVar7;
  size_t *out_binder_len;
  uint8_t *puVar8;
  size_t sVar9;
  uchar *puVar10;
  uchar *puVar11;
  pointer pEVar12;
  ulong uVar13;
  pointer __s;
  evp_hpke_ctx_st *peVar14;
  EVP_HPKE_KDF *kdf_00;
  EVP_HPKE_AEAD *aead_00;
  size_t sVar15;
  cbb_st *cbb_00;
  size_t ad_len;
  Span<const_unsigned_char> in;
  Span<unsigned_char> SVar16;
  Span<unsigned_char> local_258;
  undefined1 local_248 [8];
  Span<unsigned_char> payload_span;
  ScopedCBB aad;
  CBB payload_cbb;
  CBB enc_cbb;
  size_t payload_len;
  EVP_HPKE_AEAD *aead;
  EVP_HPKE_KDF *kdf;
  Array<unsigned_char> encoded;
  size_t hostname_len;
  size_t maximum_name_length;
  size_t padding_len;
  int local_158 [2];
  uchar *local_150;
  Span<unsigned_char> local_148;
  undefined1 local_138 [8];
  Span<unsigned_char> hello_inner_binder;
  undefined1 local_118 [8];
  Span<unsigned_char> encoded_binder;
  uchar *local_100;
  size_t local_f8;
  size_t binder_len;
  undefined1 local_e8 [8];
  Array<unsigned_char> hello_inner;
  undefined1 local_d0 [7];
  bool needs_psk_binder;
  CBB body;
  undefined1 local_90 [8];
  ScopedCBB encoded_cbb;
  ScopedCBB cbb;
  SSL *ssl;
  SSL_HANDSHAKE *hs_local;
  Span<const_unsigned_char> enc_local;
  
  enc_local.data_ = enc.data_;
  this_00 = *(bssl **)this;
  hs_local = hs;
  bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)(this + 0x6a0));
  if (!bVar3) {
    enc_local.size_._7_1_ = setup_ech_grease((SSL_HANDSHAKE *)this);
    goto LAB_003300f3;
  }
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
             ((long)&encoded_cbb.ctx_.u + 0x18));
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_90);
  Array<unsigned_char>::Array((Array<unsigned_char> *)local_e8);
  pcVar1 = *(code **)(*(long *)this_00 + 0x58);
  pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                     ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                      ((long)&encoded_cbb.ctx_.u + 0x18));
  bVar4 = (*pcVar1)(this_00,pcVar7,local_d0);
  if ((bVar4 & 1) == 0) {
LAB_0032f483:
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                  ,800);
    enc_local.size_._7_1_ = 0;
    binder_len._4_4_ = 1;
  }
  else {
    pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_90);
    iVar6 = CBB_init(pcVar7,0x100);
    if ((iVar6 == 0) ||
       (bVar3 = ssl_write_client_hello_without_extensions
                          ((SSL_HANDSHAKE *)this,(CBB *)local_d0,ssl_client_hello_inner,false),
       !bVar3)) goto LAB_0032f483;
    pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_90);
    bVar3 = ssl_write_client_hello_without_extensions
                      ((SSL_HANDSHAKE *)this,pcVar7,ssl_client_hello_inner,true);
    if (!bVar3) goto LAB_0032f483;
    pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_90);
    out_binder_len = (size_t *)CBB_len((CBB *)local_d0);
    bVar3 = ssl_add_clienthello_tlsext
                      ((SSL_HANDSHAKE *)this,(CBB *)local_d0,pcVar7,
                       (bool *)((long)&hello_inner.size_ + 7),ssl_client_hello_inner,
                       (size_t)out_binder_len);
    if (!bVar3) goto LAB_0032f483;
    pcVar1 = *(code **)(*(long *)this_00 + 0x60);
    pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                       ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                        ((long)&encoded_cbb.ctx_.u + 0x18));
    bVar4 = (*pcVar1)(this_00,pcVar7,local_e8);
    if ((bVar4 & 1) == 0) goto LAB_0032f483;
    if ((hello_inner.size_._7_1_ & 1) == 0) {
LAB_0032f6cf:
      Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                ((Span<unsigned_char_const> *)local_158,(Array<unsigned_char> *)local_e8);
      in.size_ = (size_t)out_binder_len;
      in.data_ = local_150;
      ssl_do_msg_callback(this_00,(SSL *)0x1,0x101,local_158[0],in);
      Span<unsigned_char_const>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                ((Span<unsigned_char_const> *)&padding_len,(Array<unsigned_char> *)local_e8);
      bVar3 = SSLTranscript::Update((SSLTranscript *)(this + 0x238),_padding_len);
      if (bVar3) {
        maximum_name_length = 0;
        pEVar12 = std::unique_ptr<bssl::ECHConfig,_bssl::internal::Deleter>::operator->
                            ((unique_ptr<bssl::ECHConfig,_bssl::internal::Deleter> *)(this + 0x6a0))
        ;
        uVar13 = (ulong)pEVar12->maximum_name_length;
        bVar3 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)(this_00 + 0x90));
        if (bVar3) {
          __s = std::unique_ptr<char,_bssl::internal::Deleter>::get
                          ((unique_ptr<char,_bssl::internal::Deleter> *)(this_00 + 0x90));
          encoded.size_ = strlen(__s);
          if (encoded.size_ <= uVar13) {
            maximum_name_length = uVar13 - encoded.size_;
          }
        }
        else {
          maximum_name_length = uVar13 + 9;
        }
        pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                           ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_90);
        sVar9 = CBB_len(pcVar7);
        Array<unsigned_char>::Array((Array<unsigned_char> *)&kdf);
        pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                           ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_90);
        iVar6 = CBB_add_zeros(pcVar7,(maximum_name_length -
                                     ((int)sVar9 + -1 + (int)maximum_name_length & 0x1f)) + 0x1f);
        if (iVar6 == 0) {
LAB_0032f8ea:
          enc_local.size_._7_1_ = 0;
          binder_len._4_4_ = 1;
        }
        else {
          pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                             ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_90);
          bVar3 = CBBFinishArray(pcVar7,(Array<unsigned_char> *)&kdf);
          if (!bVar3) goto LAB_0032f8ea;
          peVar14 = internal::
                    StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>
                    ::get((StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>
                           *)(this + 0x350));
          kdf_00 = EVP_HPKE_CTX_kdf(peVar14);
          peVar14 = internal::
                    StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>
                    ::get((StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>
                           *)(this + 0x350));
          aead_00 = EVP_HPKE_CTX_aead(peVar14);
          sVar9 = Array<unsigned_char>::size((Array<unsigned_char> *)&kdf);
          sVar15 = aead_overhead(aead_00);
          enc_cbb.u._24_8_ = sVar9 + sVar15;
          pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                             ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                              ((long)&encoded_cbb.ctx_.u + 0x18));
          iVar6 = CBB_init(pcVar7,0x100);
          if (iVar6 == 0) {
LAB_0032fc25:
            enc_local.size_._7_1_ = 0;
            binder_len._4_4_ = 1;
          }
          else {
            pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                               ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                ((long)&encoded_cbb.ctx_.u + 0x18));
            uVar5 = EVP_HPKE_KDF_id(kdf_00);
            iVar6 = CBB_add_u16(pcVar7,uVar5);
            if (iVar6 == 0) goto LAB_0032fc25;
            pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                               ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                ((long)&encoded_cbb.ctx_.u + 0x18));
            uVar5 = EVP_HPKE_AEAD_id(aead_00);
            iVar6 = CBB_add_u16(pcVar7,uVar5);
            if (iVar6 == 0) goto LAB_0032fc25;
            pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                               ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                ((long)&encoded_cbb.ctx_.u + 0x18));
            pEVar12 = std::unique_ptr<bssl::ECHConfig,_bssl::internal::Deleter>::operator->
                                ((unique_ptr<bssl::ECHConfig,_bssl::internal::Deleter> *)
                                 (this + 0x6a0));
            iVar6 = CBB_add_u8(pcVar7,pEVar12->config_id);
            if (iVar6 == 0) goto LAB_0032fc25;
            pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                               ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                ((long)&encoded_cbb.ctx_.u + 0x18));
            iVar6 = CBB_add_u16_length_prefixed(pcVar7,(CBB *)((long)&payload_cbb.u + 0x18));
            if (iVar6 == 0) goto LAB_0032fc25;
            puVar10 = Span<const_unsigned_char>::data((Span<const_unsigned_char> *)&hs_local);
            sVar9 = Span<const_unsigned_char>::size((Span<const_unsigned_char> *)&hs_local);
            iVar6 = CBB_add_bytes((CBB *)((long)&payload_cbb.u + 0x18),puVar10,sVar9);
            if (iVar6 == 0) goto LAB_0032fc25;
            pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                               ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                ((long)&encoded_cbb.ctx_.u + 0x18));
            iVar6 = CBB_add_u16_length_prefixed(pcVar7,(CBB *)((long)&aad.ctx_.u + 0x18));
            if ((iVar6 == 0) ||
               (iVar6 = CBB_add_zeros((CBB *)((long)&aad.ctx_.u + 0x18),enc_cbb.u._24_8_),
               iVar6 == 0)) goto LAB_0032fc25;
            pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                               ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                ((long)&encoded_cbb.ctx_.u + 0x18));
            bVar3 = CBBFinishArray(pcVar7,(Array<unsigned_char> *)(this + 0x2a8));
            if (!bVar3) goto LAB_0032fc25;
            internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::StackAllocated
                      ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&payload_span.size_)
            ;
            pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                               ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                &payload_span.size_);
            iVar6 = CBB_init(pcVar7,0x100);
            if (iVar6 == 0) {
LAB_0032fd5d:
              ERR_put_error(0x10,0,0x44,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                            ,0x36e);
              enc_local.size_._7_1_ = 0;
            }
            else {
              pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                 ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                  &payload_span.size_);
              bVar3 = ssl_write_client_hello_without_extensions
                                ((SSL_HANDSHAKE *)this,pcVar7,ssl_client_hello_outer,false);
              if (!bVar3) goto LAB_0032fd5d;
              pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                 ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                  &payload_span.size_);
              cbb_00 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                 ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                  &payload_span.size_);
              sVar9 = CBB_len(cbb_00);
              bVar3 = ssl_add_clienthello_tlsext
                                ((SSL_HANDSHAKE *)this,pcVar7,(CBB *)0x0,
                                 (bool *)((long)&hello_inner.size_ + 7),ssl_client_hello_outer,sVar9
                                );
              if (!bVar3) goto LAB_0032fd5d;
              if (((hello_inner.size_._7_1_ ^ 0xff) & 1) == 0) {
                __assert_fail("!needs_psk_binder",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                              ,0x374,
                              "bool bssl::ssl_encrypt_client_hello(SSL_HANDSHAKE *, Span<const uint8_t>)"
                             );
              }
              Span<unsigned_char>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                        (&local_258,(Array<unsigned_char> *)(this + 0x2a8));
              SVar16 = Span<unsigned_char>::last(&local_258,enc_cbb.u._24_8_);
              payload_span.data_ = (uchar *)SVar16.size_;
              local_248 = (undefined1  [8])SVar16.data_;
              iVar6 = CRYPTO_fuzzer_mode_enabled();
              if (iVar6 == 0) {
                peVar14 = internal::
                          StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>
                          ::get((StackAllocated<evp_hpke_ctx_st,_void,_&EVP_HPKE_CTX_zero,_&EVP_HPKE_CTX_cleanup>
                                 *)(this + 0x350));
                puVar10 = Span<unsigned_char>::data((Span<unsigned_char> *)local_248);
                sVar9 = Span<unsigned_char>::size((Span<unsigned_char> *)local_248);
                puVar11 = Array<unsigned_char>::data((Array<unsigned_char> *)&kdf);
                sVar15 = Array<unsigned_char>::size((Array<unsigned_char> *)&kdf);
                pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                   ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                    &payload_span.size_);
                puVar8 = CBB_data(pcVar7);
                pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                                   ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
                                    &payload_span.size_);
                ad_len = CBB_len(pcVar7);
                iVar6 = EVP_HPKE_CTX_seal(peVar14,puVar10,(size_t *)((long)&enc_cbb.u + 0x18),sVar9,
                                          puVar11,sVar15,puVar8,ad_len);
                uVar2 = enc_cbb.u._24_8_;
                if ((iVar6 != 0) &&
                   (sVar9 = Span<unsigned_char>::size((Span<unsigned_char> *)local_248),
                   uVar2 == sVar9)) goto LAB_00330077;
                enc_local.size_._7_1_ = 0;
              }
              else {
                sVar9 = Span<unsigned_char>::size((Span<unsigned_char> *)local_248);
                sVar15 = Array<unsigned_char>::size((Array<unsigned_char> *)&kdf);
                if (sVar9 != sVar15) {
                  __assert_fail("payload_span.size() == encoded.size()",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                                ,0x37a,
                                "bool bssl::ssl_encrypt_client_hello(SSL_HANDSHAKE *, Span<const uint8_t>)"
                               );
                }
                puVar10 = Span<unsigned_char>::data((Span<unsigned_char> *)local_248);
                puVar11 = Array<unsigned_char>::data((Array<unsigned_char> *)&kdf);
                sVar9 = Array<unsigned_char>::size((Array<unsigned_char> *)&kdf);
                ::OPENSSL_memcpy(puVar10,puVar11,sVar9);
LAB_00330077:
                enc_local.size_._7_1_ = 1;
              }
            }
            binder_len._4_4_ = 1;
            internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
                      ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)&payload_span.size_)
            ;
          }
        }
        Array<unsigned_char>::~Array((Array<unsigned_char> *)&kdf);
      }
      else {
        enc_local.size_._7_1_ = 0;
        binder_len._4_4_ = 1;
      }
    }
    else {
      Span<unsigned_char>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                ((Span<unsigned_char> *)&encoded_binder.size_,(Array<unsigned_char> *)local_e8);
      SVar16.size_ = (size_t)&local_f8;
      SVar16.data_ = local_100;
      bVar3 = tls13_write_psk_binder
                        (this,(SSL_HANDSHAKE *)(this + 0x238),(SSLTranscript *)encoded_binder.size_,
                         SVar16,out_binder_len);
      if (bVar3) {
        pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                           ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_90);
        puVar8 = CBB_data(pcVar7);
        pcVar7 = internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::get
                           ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_90);
        sVar9 = CBB_len(pcVar7);
        Span<unsigned_char>::Span((Span<unsigned_char> *)&hello_inner_binder.size_,puVar8,sVar9);
        SVar16 = Span<unsigned_char>::last
                           ((Span<unsigned_char> *)&hello_inner_binder.size_,local_f8);
        encoded_binder.data_ = (uchar *)SVar16.size_;
        local_118 = (undefined1  [8])SVar16.data_;
        Span<unsigned_char>::Span<bssl::Array<unsigned_char>,void,bssl::Array<unsigned_char>>
                  (&local_148,(Array<unsigned_char> *)local_e8);
        SVar16 = Span<unsigned_char>::last(&local_148,local_f8);
        hello_inner_binder.data_ = (uchar *)SVar16.size_;
        local_138 = (undefined1  [8])SVar16.data_;
        puVar10 = Span<unsigned_char>::data((Span<unsigned_char> *)local_118);
        puVar11 = Span<unsigned_char>::data((Span<unsigned_char> *)local_138);
        ::OPENSSL_memcpy(puVar10,puVar11,local_f8);
        goto LAB_0032f6cf;
      }
      enc_local.size_._7_1_ = 0;
      binder_len._4_4_ = 1;
    }
  }
  Array<unsigned_char>::~Array((Array<unsigned_char> *)local_e8);
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)local_90);
  internal::StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup>::~StackAllocated
            ((StackAllocated<cbb_st,_void,_&CBB_zero,_&CBB_cleanup> *)
             ((long)&encoded_cbb.ctx_.u + 0x18));
LAB_003300f3:
  return (bool)(enc_local.size_._7_1_ & 1);
}

Assistant:

bool ssl_encrypt_client_hello(SSL_HANDSHAKE *hs, Span<const uint8_t> enc) {
  SSL *const ssl = hs->ssl;
  if (!hs->selected_ech_config) {
    return setup_ech_grease(hs);
  }

  // Construct ClientHelloInner and EncodedClientHelloInner. See
  // draft-ietf-tls-esni-13, sections 5.1 and 6.1.
  ScopedCBB cbb, encoded_cbb;
  CBB body;
  bool needs_psk_binder;
  Array<uint8_t> hello_inner;
  if (!ssl->method->init_message(ssl, cbb.get(), &body, SSL3_MT_CLIENT_HELLO) ||
      !CBB_init(encoded_cbb.get(), 256) ||
      !ssl_write_client_hello_without_extensions(hs, &body,
                                                 ssl_client_hello_inner,
                                                 /*empty_session_id=*/false) ||
      !ssl_write_client_hello_without_extensions(hs, encoded_cbb.get(),
                                                 ssl_client_hello_inner,
                                                 /*empty_session_id=*/true) ||
      !ssl_add_clienthello_tlsext(hs, &body, encoded_cbb.get(),
                                  &needs_psk_binder, ssl_client_hello_inner,
                                  CBB_len(&body)) ||
      !ssl->method->finish_message(ssl, cbb.get(), &hello_inner)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  if (needs_psk_binder) {
    size_t binder_len;
    if (!tls13_write_psk_binder(hs, hs->inner_transcript, Span(hello_inner),
                                &binder_len)) {
      return false;
    }
    // Also update the EncodedClientHelloInner.
    auto encoded_binder =
        Span(const_cast<uint8_t *>(CBB_data(encoded_cbb.get())),
             CBB_len(encoded_cbb.get()))
            .last(binder_len);
    auto hello_inner_binder = Span(hello_inner).last(binder_len);
    OPENSSL_memcpy(encoded_binder.data(), hello_inner_binder.data(),
                   binder_len);
  }

  ssl_do_msg_callback(ssl, /*is_write=*/1, SSL3_RT_CLIENT_HELLO_INNER,
                      hello_inner);
  if (!hs->inner_transcript.Update(hello_inner)) {
    return false;
  }

  // Pad the EncodedClientHelloInner. See draft-ietf-tls-esni-13, section 6.1.3.
  size_t padding_len = 0;
  size_t maximum_name_length = hs->selected_ech_config->maximum_name_length;
  if (ssl->hostname) {
    size_t hostname_len = strlen(ssl->hostname.get());
    if (hostname_len <= maximum_name_length) {
      padding_len = maximum_name_length - hostname_len;
    }
  } else {
    // No SNI. Pad up to |maximum_name_length|, including server_name extension
    // overhead.
    padding_len = 9 + maximum_name_length;
  }
  // Pad the whole thing to a multiple of 32 bytes.
  padding_len += 31 - ((CBB_len(encoded_cbb.get()) + padding_len - 1) % 32);
  Array<uint8_t> encoded;
  if (!CBB_add_zeros(encoded_cbb.get(), padding_len) ||
      !CBBFinishArray(encoded_cbb.get(), &encoded)) {
    return false;
  }

  // Encrypt |encoded|. See draft-ietf-tls-esni-13, section 6.1.1. First,
  // assemble the extension with a placeholder value for ClientHelloOuterAAD.
  // See draft-ietf-tls-esni-13, section 5.2.
  const EVP_HPKE_KDF *kdf = EVP_HPKE_CTX_kdf(hs->ech_hpke_ctx.get());
  const EVP_HPKE_AEAD *aead = EVP_HPKE_CTX_aead(hs->ech_hpke_ctx.get());
  size_t payload_len = encoded.size() + aead_overhead(aead);
  CBB enc_cbb, payload_cbb;
  if (!CBB_init(cbb.get(), 256) ||
      !CBB_add_u16(cbb.get(), EVP_HPKE_KDF_id(kdf)) ||
      !CBB_add_u16(cbb.get(), EVP_HPKE_AEAD_id(aead)) ||
      !CBB_add_u8(cbb.get(), hs->selected_ech_config->config_id) ||
      !CBB_add_u16_length_prefixed(cbb.get(), &enc_cbb) ||
      !CBB_add_bytes(&enc_cbb, enc.data(), enc.size()) ||
      !CBB_add_u16_length_prefixed(cbb.get(), &payload_cbb) ||
      !CBB_add_zeros(&payload_cbb, payload_len) ||
      !CBBFinishArray(cbb.get(), &hs->ech_client_outer)) {
    return false;
  }

  // Construct ClientHelloOuterAAD.
  // TODO(https://crbug.com/boringssl/275): This ends up constructing the
  // ClientHelloOuter twice. Instead, reuse |aad| for the ClientHello, now that
  // draft-12 made the length prefixes match.
  bssl::ScopedCBB aad;
  if (!CBB_init(aad.get(), 256) ||
      !ssl_write_client_hello_without_extensions(hs, aad.get(),
                                                 ssl_client_hello_outer,
                                                 /*empty_session_id=*/false) ||
      !ssl_add_clienthello_tlsext(hs, aad.get(), /*out_encoded=*/nullptr,
                                  &needs_psk_binder, ssl_client_hello_outer,
                                  CBB_len(aad.get()))) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  // ClientHelloOuter may not require a PSK binder. Otherwise, we have a
  // circular dependency.
  assert(!needs_psk_binder);

  // Replace the payload in |hs->ech_client_outer| with the encrypted value.
  auto payload_span = Span(hs->ech_client_outer).last(payload_len);
  if (CRYPTO_fuzzer_mode_enabled()) {
    // In fuzzer mode, the server expects a cleartext payload.
    assert(payload_span.size() == encoded.size());
    OPENSSL_memcpy(payload_span.data(), encoded.data(), encoded.size());
  } else {
    if (!EVP_HPKE_CTX_seal(hs->ech_hpke_ctx.get(), payload_span.data(),
                           &payload_len, payload_span.size(), encoded.data(),
                           encoded.size(), CBB_data(aad.get()),
                           CBB_len(aad.get())) ||
        payload_len != payload_span.size()) {
      return false;
    }
  }

  return true;
}